

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

void * memcpy(void *__dest,void *__src,size_t __n)

{
  size_t sVar1;
  uchar *s1_;
  
  if (__n != 0) {
    sVar1 = 0;
    do {
      *(undefined1 *)((long)__dest + sVar1) = *(undefined1 *)((long)__src + sVar1);
      sVar1 = sVar1 + 1;
    } while (__n != sVar1);
  }
  return __dest;
}

Assistant:

void *memcpy(void *s1, const void *s2, size_t n) {
    unsigned char *s1_ = s1;
    const unsigned char *s2_ = s2;
    for (size_t i = 0; i < n; ++i) {
        s1_[i] = s2_[i];
    }

    return s1;
}